

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O3

Am_Value find_get_sel_widgets_impl_parent_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar3;
  Am_Object sel_handles_command;
  Am_Object sel_handles;
  Am_Object local_20;
  Am_Object local_18;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(in_RSI,0x197,0);
  Am_Object::Am_Object(&local_18,pAVar2);
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    Am_Object::Get_Object(&local_20,(Am_Slot_Key)&local_18,0xc5);
    bVar1 = Am_Object::Valid(&local_20);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&local_20,0x154,1);
      Am_Value::operator=((Am_Value *)self,pAVar2);
    }
    Am_Object::~Am_Object(&local_20);
  }
  Am_Object::~Am_Object(&local_18);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, find_get_sel_widgets_impl_parent)
{
  Am_Value value;
  Am_Object sel_handles = self.Get(Am_SELECTION_WIDGET);
  if (sel_handles.Valid()) {
    Am_Object sel_handles_command = sel_handles.Get_Object(Am_COMMAND);
    if (sel_handles_command.Valid())
      value = sel_handles_command.Peek(Am_IMPLEMENTATION_PARENT);
  }
  return value;
}